

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Roboteq.cpp
# Opt level: O1

void * RoboteqThread(void *pParam)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  char *pcVar15;
  double dVar16;
  int selectedchannels [3];
  int pws [3];
  CHRONO chrono_period;
  char szTemp [256];
  ROBOTEQ roboteq;
  char szCfgFilePath [256];
  char szSaveFilePath [256];
  timespec local_c68;
  int local_c58 [4];
  int local_c48;
  int local_c44;
  double local_c40;
  double local_c38;
  timespec local_c30;
  long local_c20;
  ulong uStack_c18;
  long local_c10;
  ulong uStack_c08;
  timespec local_c00;
  int local_bf0;
  char local_be8 [256];
  ROBOTEQ local_ae8;
  char local_238 [256];
  char local_138 [264];
  
  iVar12 = (int)pParam;
  sprintf(local_238,"Roboteq%d.txt",(ulong)pParam & 0xffffffff);
  memset(&local_ae8,0,0x8b0);
  iVar3 = clock_getres(4,&local_c00);
  if ((iVar3 == 0) && (iVar3 = clock_gettime(4,&local_c30), iVar3 == 0)) {
    local_bf0 = 0;
    local_c20 = 0;
    uStack_c18 = 0;
    local_c10 = 0;
    uStack_c08 = 0;
  }
  local_c48 = 100;
  bVar1 = false;
  local_c44 = 0;
  do {
    lVar9 = (long)local_c48;
    while( true ) {
      if (local_bf0 == 0) {
        clock_gettime(4,&local_c68);
        local_c20 = local_c68.tv_sec;
        uStack_c18 = local_c68.tv_nsec;
        local_c68.tv_sec =
             (local_c68.tv_sec + local_c10 + (long)(local_c68.tv_nsec + uStack_c08) / 1000000000) -
             local_c30.tv_sec;
        local_c68.tv_nsec = (long)(local_c68.tv_nsec + uStack_c08) % 1000000000 - local_c30.tv_nsec;
        if (local_c68.tv_nsec < 0) {
          local_c68.tv_sec = local_c68.tv_sec + local_c68.tv_nsec / 1000000000 + -1;
          local_c68.tv_nsec = local_c68.tv_nsec % 1000000000 + 1000000000;
        }
        local_c10 = local_c68.tv_sec;
        uStack_c08 = local_c68.tv_nsec;
      }
      iVar3 = clock_getres(4,&local_c00);
      if ((iVar3 == 0) && (iVar3 = clock_gettime(4,&local_c30), iVar3 == 0)) {
        local_bf0 = 0;
        local_c10 = 0;
        uStack_c08 = 0;
        local_c20 = 0;
        uStack_c18 = 0;
      }
      local_c68.tv_sec = lVar9 / 1000;
      local_c68.tv_nsec = (lVar9 % 1000) * 1000000;
      nanosleep(&local_c68,(timespec *)0x0);
      if (bPauseRoboteq[iVar12] == 0) break;
      if (bVar1) {
        puts("Roboteq paused.");
        iVar3 = CloseRS232Port(&local_ae8.RS232Port);
        pcVar15 = "Roboteq disconnection failed.";
        if (iVar3 == 0) {
          pcVar15 = "Roboteq disconnected.";
        }
        puts(pcVar15);
      }
      if (bExit != 0) {
        bVar2 = true;
        goto LAB_001abfb3;
      }
      local_c68.tv_sec = 0;
      local_c68.tv_nsec = 100000000;
      bVar1 = false;
      nanosleep(&local_c68,(timespec *)0x0);
    }
    if (bRestartRoboteq[iVar12] != 0) {
      if (bVar1) {
        puts("Restarting a Roboteq.");
        iVar3 = CloseRS232Port(&local_ae8.RS232Port);
        pcVar15 = "Roboteq disconnection failed.";
        if (iVar3 == 0) {
          pcVar15 = "Roboteq disconnected.";
        }
        puts(pcVar15);
      }
      bRestartRoboteq[iVar12] = 0;
      bVar1 = false;
    }
    if (bVar1) {
      if (robid < 0x8000) {
        if (((robid == 0x1000) || (robid == 0x2000)) || (robid == 0x4000)) goto LAB_001abacc;
LAB_001abc3c:
        pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
        local_c40 = u1 * 1000.0;
        local_c38 = u2 * 1000.0;
        pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
        local_c58[0] = 0;
        local_c58[1] = 0;
        local_c58[2] = 0;
        lVar14 = (long)local_ae8.rightthrusterchan;
        dVar16 = local_c38 * 0.5;
        local_c58[lVar14] = (int)(local_c40 * 0.5) + 0x5dc;
        lVar9 = (long)local_ae8.leftthrusterchan;
        local_c58[lVar9] = (int)dVar16 + 0x5dc;
        iVar3 = local_c58[lVar14];
        if (1999 < iVar3) {
          iVar3 = 2000;
        }
        if (iVar3 < 0x3e9) {
          iVar3 = 1000;
        }
        local_c58[lVar14] = iVar3;
        iVar3 = local_c58[lVar9];
        if (1999 < local_c58[lVar9]) {
          iVar3 = 2000;
        }
        local_c68.tv_sec = 0;
        if (iVar3 < 0x3e9) {
          iVar3 = 1000;
        }
        local_c68.tv_nsec = local_c68.tv_nsec & 0xffffffff00000000;
        local_c58[lVar9] = iVar3;
        *(undefined4 *)((long)&local_c68.tv_sec + lVar14 * 4) = 1;
        *(undefined4 *)((long)&local_c68.tv_sec + lVar9 * 4) = 1;
      }
      else {
        if (((robid != 0x8000) && (robid != 0x200000)) && (robid != 0x100000)) goto LAB_001abc3c;
LAB_001abacc:
        pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
        local_c40 = uw_f * 1000.0;
        local_c38 = u_f * 1000.0;
        pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
        local_c68.tv_nsec = local_c68.tv_nsec & 0xffffffff00000000;
        local_c58[2] = 0;
        local_c58[0] = (int)(local_c40 * 0.5) + 0x5dc;
        local_c58[1] = (int)(local_c38 * 0.5) + 0x5dc;
        if (1999 < local_c58[0]) {
          local_c58[0] = 2000;
        }
        if (local_c58[0] < 0x3e9) {
          local_c58[0] = 1000;
        }
        if (1999 < local_c58[1]) {
          local_c58[1] = 2000;
        }
        if (local_c58[1] < 0x3e9) {
          local_c58[1] = 1000;
        }
        local_c68.tv_sec = 0x100000001;
      }
      iVar3 = SetAllPWMsRoboteq(&local_ae8,(int *)&local_c68,local_c58);
      if (iVar3 == 0) {
LAB_001abf65:
        bVar1 = true;
        bVar2 = false;
      }
      else {
        puts("Connection to a Roboteq lost.");
        iVar3 = CloseRS232Port(&local_ae8.RS232Port);
        if (iVar3 == 0) {
          pcVar15 = "Roboteq disconnected.";
        }
        else {
          pcVar15 = "Roboteq disconnection failed.";
        }
        puts(pcVar15);
LAB_001abbea:
        bVar1 = false;
        bVar2 = true;
      }
    }
    else {
      iVar4 = ConnectRoboteq(&local_ae8,local_238);
      iVar3 = local_ae8.threadperiod;
      if (iVar4 != 0) {
        local_c68.tv_sec = 1;
        local_c68.tv_nsec = 0;
        nanosleep(&local_c68,(timespec *)0x0);
        goto LAB_001abbea;
      }
      pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
      lVar9 = (long)local_ae8.vbat1analoginputchan;
      if (lVar9 == -1) {
        vbat1_filtered = 0.0;
        vbat1_threshold = 0.0;
      }
      else {
        vbat1_filtered = local_ae8.analoginputthreshold[lVar9];
        vbat1_threshold = local_ae8.analoginputthreshold[lVar9];
      }
      if ((long)local_ae8.ibat1analoginputchan == -1) {
        ibat1_filtered = 0.0;
      }
      else {
        ibat1_filtered = local_ae8.analoginputthreshold[local_ae8.ibat1analoginputchan];
      }
      lVar9 = (long)local_ae8.vbat2analoginputchan;
      if (lVar9 == -1) {
        vbat2_filtered = 0.0;
        vbat2_threshold = 0.0;
      }
      else {
        vbat2_filtered = local_ae8.analoginputthreshold[lVar9];
        vbat2_threshold = local_ae8.analoginputthreshold[lVar9];
      }
      if ((long)local_ae8.ibat2analoginputchan == -1) {
        ibat2_filtered = 0.0;
      }
      else {
        ibat2_filtered = local_ae8.analoginputthreshold[local_ae8.ibat2analoginputchan];
      }
      local_c48 = iVar3;
      vswitchthreshold = local_ae8.analoginputthreshold[local_ae8.switchanaloginputchan];
      vswitchcoef = local_ae8.analoginputcoef[local_ae8.switchanaloginputchan];
      pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
      if ((FILE *)local_ae8.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)local_ae8.pfSaveFile);
        local_ae8.pfSaveFile = (FILE *)0x0;
      }
      bVar2 = false;
      bVar1 = true;
      if ((local_ae8.bSaveRawData != 0) && ((FILE *)local_ae8.pfSaveFile == (FILE *)0x0)) {
        if (local_ae8.szCfgFilePath[0] == '\0') {
          builtin_strncpy(local_be8,"Roboteq",8);
        }
        else {
          sprintf(local_be8,"%.127s",local_ae8.szCfgFilePath);
        }
        sVar6 = strlen(local_be8);
        uVar5 = (uint)sVar6;
        uVar13 = sVar6 & 0xffffffff;
        uVar7 = (int)uVar5 >> 0x1f & uVar5;
        uVar11 = sVar6 & 0xffffffff;
        do {
          uVar13 = uVar13 - 1;
          uVar10 = (uint)uVar11;
          uVar11 = (ulong)(uVar7 - 1);
          uVar8 = uVar7;
          if ((int)uVar10 < 1) break;
          uVar11 = (ulong)(uVar10 - 1);
          uVar8 = uVar10;
        } while (local_be8[uVar13 & 0xffffffff] != '.');
        if ((int)uVar8 <= (int)uVar5 && 1 < (int)uVar8) {
          memset(local_be8 + uVar11,0,sVar6 - uVar11);
        }
        pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
        pcVar15 = strtimeex_fns();
        sprintf(local_138,"log/%.127s_%.64s.txt",local_be8,pcVar15);
        pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
        local_ae8.pfSaveFile = (FILE *)fopen(local_138,"wb");
        if ((FILE *)local_ae8.pfSaveFile != (FILE *)0x0) goto LAB_001abf65;
        puts("Unable to create Roboteq data file.");
        bVar2 = false;
        goto LAB_001abfb3;
      }
    }
    if ((bVar2) &&
       (local_c44 = local_c44 + 1, ExitOnErrorCount <= local_c44 && 0 < ExitOnErrorCount)) {
      bExit = 1;
    }
    if (bExit != 0) {
LAB_001abfb3:
      iVar12 = local_c48;
      local_c68.tv_nsec = local_c68.tv_nsec & 0xffffffff00000000;
      local_c58[0] = 0;
      local_c58[1] = 0;
      local_c58[2] = 0;
      lVar9 = (long)local_ae8.rightthrusterchan;
      local_c58[lVar9] = 0x5dc;
      lVar14 = (long)local_ae8.leftthrusterchan;
      local_c58[lVar14] = 0x5dc;
      iVar3 = local_c58[lVar9];
      if (1999 < iVar3) {
        iVar3 = 2000;
      }
      if (iVar3 < 0x3e9) {
        iVar3 = 1000;
      }
      local_c58[lVar9] = iVar3;
      iVar3 = 2000;
      if (local_c58[lVar14] < 2000) {
        iVar3 = local_c58[lVar14];
      }
      local_c68.tv_sec = 0;
      if (iVar3 < 0x3e9) {
        iVar3 = 1000;
      }
      local_c58[lVar14] = iVar3;
      *(undefined4 *)((long)&local_c68.tv_sec + lVar9 * 4) = 1;
      *(undefined4 *)((long)&local_c68.tv_sec + lVar14 * 4) = 1;
      SetAllPWMsRoboteq(&local_ae8,(int *)&local_c68,local_c58);
      local_c68.tv_sec = (long)iVar12 / 1000;
      local_c68.tv_nsec = ((long)iVar12 % 1000) * 1000000;
      nanosleep(&local_c68,(timespec *)0x0);
      if (local_bf0 == 0) {
        clock_gettime(4,&local_c68);
        local_c20 = local_c68.tv_sec;
        uStack_c18 = local_c68.tv_nsec;
        local_c68.tv_sec =
             (local_c68.tv_sec + local_c10 + (long)(local_c68.tv_nsec + uStack_c08) / 1000000000) -
             local_c30.tv_sec;
        local_c68.tv_nsec = (long)(local_c68.tv_nsec + uStack_c08) % 1000000000 - local_c30.tv_nsec;
        if (local_c68.tv_nsec < 0) {
          local_c68.tv_sec = local_c68.tv_sec + local_c68.tv_nsec / 1000000000 + -1;
          local_c68.tv_nsec = local_c68.tv_nsec % 1000000000 + 1000000000;
        }
        local_c10 = local_c68.tv_sec;
        uStack_c08 = local_c68.tv_nsec;
      }
      if ((FILE *)local_ae8.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)local_ae8.pfSaveFile);
        local_ae8.pfSaveFile = (FILE *)0x0;
      }
      if (!bVar2) {
        iVar3 = CloseRS232Port(&local_ae8.RS232Port);
        pcVar15 = "Roboteq disconnection failed.";
        if (iVar3 == 0) {
          pcVar15 = "Roboteq disconnected.";
        }
        puts(pcVar15);
      }
      if (bExit == 0) {
        bExit = 1;
      }
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

THREAD_PROC_RETURN_VALUE RoboteqThread(void* pParam)
{
	ROBOTEQ roboteq;
	double rudder = 0, thrust = 0, thrust1 = 0, thrust2 = 0;
	//int counter = 0, counter_modulo = 0;
	int res = EXIT_SUCCESS;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 100;
	int errcount = 0;
	int deviceid = (int)(intptr_t)pParam;
	char szCfgFilePath[256];
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	sprintf(szCfgFilePath, "Roboteq%d.txt", deviceid);

	memset(&roboteq, 0, sizeof(ROBOTEQ));

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		mSleep(threadperiod);

		if (bPauseRoboteq[deviceid])
		{
			if (bConnected)
			{
				printf("Roboteq paused.\n");
				bConnected = FALSE;
				DisconnectRoboteq(&roboteq);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartRoboteq[deviceid])
		{
			if (bConnected)
			{
				printf("Restarting a Roboteq.\n");
				bConnected = FALSE;
				DisconnectRoboteq(&roboteq);
			}
			bRestartRoboteq[deviceid] = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectRoboteq(&roboteq, szCfgFilePath) == EXIT_SUCCESS)
			{
				bConnected = TRUE;
				threadperiod = roboteq.threadperiod;

				EnterCriticalSection(&StateVariablesCS);

				if (roboteq.vbat1analoginputchan != -1) vbat1_filtered = roboteq.analoginputthreshold[roboteq.vbat1analoginputchan]; else vbat1_filtered = 0;
				if (roboteq.vbat1analoginputchan != -1) vbat1_threshold = roboteq.analoginputthreshold[roboteq.vbat1analoginputchan]; else vbat1_threshold = 0;
				if (roboteq.ibat1analoginputchan != -1) ibat1_filtered = roboteq.analoginputthreshold[roboteq.ibat1analoginputchan]; else ibat1_filtered = 0;
				if (roboteq.vbat2analoginputchan != -1) vbat2_filtered = roboteq.analoginputthreshold[roboteq.vbat2analoginputchan]; else vbat2_filtered = 0;
				if (roboteq.vbat2analoginputchan != -1) vbat2_threshold = roboteq.analoginputthreshold[roboteq.vbat2analoginputchan]; else vbat2_threshold = 0;
				if (roboteq.ibat2analoginputchan != -1) ibat2_filtered = roboteq.analoginputthreshold[roboteq.ibat2analoginputchan]; else ibat2_filtered = 0;
				vswitchcoef = roboteq.analoginputcoef[roboteq.switchanaloginputchan];
				vswitchthreshold = roboteq.analoginputthreshold[roboteq.switchanaloginputchan];

				LeaveCriticalSection(&StateVariablesCS);

				if (roboteq.pfSaveFile != NULL)
				{
					fclose(roboteq.pfSaveFile);
					roboteq.pfSaveFile = NULL;
				}
				if ((roboteq.bSaveRawData)&&(roboteq.pfSaveFile == NULL))
				{
					if (strlen(roboteq.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", roboteq.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "Roboteq");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.txt", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					roboteq.pfSaveFile = fopen(szSaveFilePath, "wb");
					if (roboteq.pfSaveFile == NULL)
					{
						printf("Unable to create Roboteq data file.\n");
						break;
					}
				}
			}
			else
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			res = EXIT_SUCCESS;

			switch (robid)
			{
			case BUGGY_SIMULATOR_ROBID:
			case BUGGY_ROBID:
			case SAILBOAT_SIMULATOR_ROBID:
			case VAIMOS_ROBID:
			case SAILBOAT_ROBID:
			case SAILBOAT2_ROBID:
				EnterCriticalSection(&StateVariablesCS);
				rudder = uw_f;
				thrust = u_f;
				LeaveCriticalSection(&StateVariablesCS);
				res = Set2ActuatorsRoboteq(&roboteq, rudder, thrust);
				break;
			case BUBBLE_ROBID:
			case ETAS_WHEEL_ROBID:
			default:
				EnterCriticalSection(&StateVariablesCS);
				thrust1 = u1;
				thrust2 = u2;
				LeaveCriticalSection(&StateVariablesCS);
				res = SetThrustersRoboteq(&roboteq, thrust1, thrust2);
				break;
			}

			if (res != EXIT_SUCCESS)
			{
				printf("Connection to a Roboteq lost.\n");
				bConnected = FALSE;
				DisconnectRoboteq(&roboteq);
			}
		}

		//printf("RoboteqThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	switch (robid)
	{
	case BUBBLE_ROBID:
	case ETAS_WHEEL_ROBID:
	default:
		SetThrustersRoboteq(&roboteq, 0, 0);
		mSleep(threadperiod);
		break;
	}

	StopChronoQuick(&chrono_period);

	if (roboteq.pfSaveFile != NULL)
	{
		fclose(roboteq.pfSaveFile);
		roboteq.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectRoboteq(&roboteq);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}